

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O1

void deqp::gles3::Functional::getDistinctSamplerTypes
               (vector<glu::DataType,_std::allocator<glu::DataType>_> *dst,VarType *type)

{
  iterator __position;
  StructType *pSVar1;
  __normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
  _Var2;
  pointer pSVar3;
  long lVar4;
  long lVar5;
  DataType local_24;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type == TYPE_BASIC) {
    local_24 = (type->m_data).basic.type;
    if (local_24 - TYPE_SAMPLER_1D < 0x1e) {
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>,__gnu_cxx::__ops::_Iter_equals_val<glu::DataType_const>>
                        ((dst->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                         (dst->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>).
                         _M_impl.super__Vector_impl_data._M_finish,&local_24);
      __position._M_current =
           (dst->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (_Var2._M_current == __position._M_current) {
        if (__position._M_current ==
            (dst->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<glu::DataType,std::allocator<glu::DataType>>::
          _M_realloc_insert<glu::DataType_const&>
                    ((vector<glu::DataType,std::allocator<glu::DataType>> *)dst,__position,&local_24
                    );
        }
        else {
          *__position._M_current = local_24;
          (dst->super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
    }
  }
  else {
    pSVar1 = (type->m_data).structPtr;
    pSVar3 = (pSVar1->m_members).
             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(pSVar1->m_members).
                                super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) >> 3) *
            -0x49249249) {
      lVar5 = 0x20;
      lVar4 = 0;
      do {
        getDistinctSamplerTypes(dst,(VarType *)((long)&(pSVar3->m_name)._M_dataplus._M_p + lVar5));
        lVar4 = lVar4 + 1;
        pSVar3 = (pSVar1->m_members).
                 super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = lVar5 + 0x38;
      } while (lVar4 < (int)((ulong)((long)(pSVar1->m_members).
                                           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3
                                    ) >> 3) * -0x49249249);
    }
  }
  return;
}

Assistant:

static void getDistinctSamplerTypes (vector<glu::DataType>& dst, const glu::VarType& type)
{
	if (type.isBasicType())
	{
		const glu::DataType basicType = type.getBasicType();
		if (glu::isDataTypeSampler(basicType) && std::find(dst.begin(), dst.end(), basicType) == dst.end())
			dst.push_back(basicType);
	}
	else if (type.isArrayType())
		getDistinctSamplerTypes(dst, type.getElementType());
	else
	{
		DE_ASSERT(type.isStructType());
		const StructType& structType = *type.getStructPtr();
		for (int i = 0; i < structType.getNumMembers(); i++)
			getDistinctSamplerTypes(dst, structType.getMember(i).getType());
	}
}